

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::write_int_data<char>::write_int_data
          (write_int_data<char> *this,int num_digits,string_view prefix,
          basic_format_specs<char> *specs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (-1 < num_digits) {
    uVar2 = (ulong)(uint)num_digits + prefix.size_;
    this->size = uVar2;
    this->padding = 0;
    if ((specs->field_0x9 & 0xf) == 4) {
      uVar3 = (ulong)specs->width;
      if ((long)uVar3 < 0) goto LAB_0038cee8;
      if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
        this->padding = uVar3 - uVar2;
        this->size = uVar3;
      }
    }
    else {
      uVar1 = specs->precision;
      if (num_digits < (int)uVar1) {
        this->size = prefix.size_ + (ulong)uVar1;
        if ((int)(uVar1 - num_digits) < 0) goto LAB_0038cee8;
        this->padding = (ulong)(uVar1 - num_digits);
      }
    }
    return;
  }
LAB_0038cee8:
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

write_int_data(int num_digits, string_view prefix,
                 const basic_format_specs<Char>& specs)
      : size(prefix.size() + to_unsigned(num_digits)), padding(0) {
    if (specs.align == align::numeric) {
      auto width = to_unsigned(specs.width);
      if (width > size) {
        padding = width - size;
        size = width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
    }
  }